

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O2

void __thiscall QSplitterHandle::paintEvent(QSplitterHandle *this,QPaintEvent *param_1)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  QPalette *pQVar4;
  QStyle *pQVar5;
  QFlagsStorage<QStyle::StateFlag> QVar6;
  QFlagsStorage<QStyle::StateFlag> QVar7;
  long in_FS_OFFSET;
  QPainter p;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  undefined1 auStack_40 [16];
  QObject *pQStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  _p = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter(&p,&(this->super_QWidget).super_QPaintDevice);
  auStack_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_30 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  auStack_40._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption((QStyleOption *)&local_68,0,0);
  local_58 = (undefined1  [16])QWidget::contentsRect(&this->super_QWidget);
  pQVar4 = QWidget::palette(&this->super_QWidget);
  QPalette::operator=((QPalette *)auStack_40,pQVar4);
  lVar3 = *(long *)&(this->super_QWidget).field_0x8;
  QVar7.i = (uint)(*(int *)(lVar3 + 0x260) == 1) << 7;
  bVar1 = *(byte *)(lVar2 + 0x268);
  QVar6.i = bVar1 & 4 | (bVar1 & 2) << 0xc | QVar7.i;
  if ((bVar1 & 6) != 0) {
    QVar7.i = QVar6.i;
  }
  if ((((this->super_QWidget).data)->widget_attributes & 1) == 0) {
    QVar7.i = QVar6.i | 1;
  }
  puStack_60 = (undefined1 *)CONCAT44(puStack_60._4_4_,QVar7.i);
  pQVar5 = QWidget::style(*(QWidget **)(lVar3 + 0x10));
  (**(code **)(*(long *)pQVar5 + 0xb8))
            (pQVar5,0x1c,(QStyleOption *)&local_68,&p,*(undefined8 *)(lVar2 + 600));
  QStyleOption::~QStyleOption((QStyleOption *)&local_68);
  QPainter::~QPainter(&p);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSplitterHandle::paintEvent(QPaintEvent *)
{
    Q_D(QSplitterHandle);
    QPainter p(this);
    QStyleOption opt(0);
    opt.rect = contentsRect();
    opt.palette = palette();
    if (orientation() == Qt::Horizontal)
        opt.state = QStyle::State_Horizontal;
    else
        opt.state = QStyle::State_None;
    if (d->hover)
        opt.state |= QStyle::State_MouseOver;
    if (d->pressed)
        opt.state |= QStyle::State_Sunken;
    if (isEnabled())
        opt.state |= QStyle::State_Enabled;
    parentWidget()->style()->drawControl(QStyle::CE_Splitter, &opt, &p, d->s);
}